

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

int vs_vlc(bitstream *str,uint32_t *val,vs_vlc_val *tab)

{
  int iVar1;
  int local_cc;
  uint32_t local_c8;
  int n;
  uint32_t bit_1 [32];
  int local_3c;
  int local_38;
  int j_1;
  int i_1;
  uint32_t bit;
  int j;
  int i;
  vs_vlc_val *tab_local;
  uint32_t *val_local;
  bitstream *str_local;
  
  val_local = &str->dir;
  tab_local = (vs_vlc_val *)val;
  _j = tab;
  if (str->dir == VS_ENCODE) {
    bit = 0;
    while (tab[(int)bit].blen != 0) {
      if (*val == tab[(int)bit].val) {
        i_1 = 0;
        while( true ) {
          if (_j[(int)bit].blen <= i_1) {
            return 0;
          }
          j_1 = _j[(int)bit].bits[i_1];
          iVar1 = vs_u((bitstream *)val_local,(uint32_t *)&j_1,1);
          if (iVar1 != 0) break;
          i_1 = i_1 + 1;
        }
        return 1;
      }
      bit = bit + 1;
    }
    fprintf(_stderr,"No VLC code for a value\n");
  }
  else {
    local_cc = 0;
    local_38 = 0;
    while (_j[local_38].blen != 0) {
      for (local_3c = 0; local_3c < _j[local_38].blen; local_3c = local_3c + 1) {
        if (local_3c == local_cc) {
          iVar1 = vs_u((bitstream *)val_local,&local_c8 + local_3c,1);
          if (iVar1 != 0) {
            return 1;
          }
          local_cc = local_3c + 1;
        }
        if ((&local_c8)[local_3c] != _j[local_38].bits[local_3c]) break;
      }
      if (local_3c == _j[local_38].blen) {
        tab_local->val = _j[local_38].val;
        return 0;
      }
      local_38 = local_38 + 1;
    }
    fprintf(_stderr,"Invalid VLC code\n");
  }
  return 1;
}

Assistant:

int vs_vlc(struct bitstream *str, uint32_t *val, const struct vs_vlc_val *tab) {
	if (str->dir == VS_ENCODE) {
		int i, j;
		for (i = 0; tab[i].blen; i++) {
			if (*val == tab[i].val) {
				uint32_t bit;
				for (j = 0; j < tab[i].blen; j++) {
					bit = tab[i].bits[j];
					if (vs_u(str, &bit, 1))
						return 1;
				}
				return 0;
			}
		}
		fprintf(stderr, "No VLC code for a value\n");
		return 1;
	} else {
		int i, j;
		uint32_t bit[32];
		int n = 0;
		for (i = 0; tab[i].blen; i++) {
			for (j = 0; j < tab[i].blen; j++) {
				if (j == n) {
					if (vs_u(str, &bit[j], 1)) return 1;
					n = j + 1;
				}
				if (bit[j] != tab[i].bits[j])
					break;
			}
			if (j == tab[i].blen) {
				*val = tab[i].val;
				return 0;
			}
		}
		fprintf(stderr, "Invalid VLC code\n");
		return 1;
	}
}